

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DLevelScript::Serialize(DLevelScript *this,FArchive *arc)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  FArchive *pFVar4;
  ulong uVar5;
  SDWORD *pSVar6;
  FBehavior *pFVar7;
  int *piVar8;
  ushort local_20;
  WORD local_1e;
  DWORD local_1c;
  WORD lib_1;
  WORD lib;
  DWORD i;
  FArchive *arc_local;
  DLevelScript *this_local;
  
  _lib_1 = arc;
  arc_local = (FArchive *)this;
  DObject::Serialize(&this->super_DObject,arc);
  P_SerializeACSScriptNumber(_lib_1,&this->script,false);
  pFVar4 = ::operator<<(_lib_1,&this->state);
  pFVar4 = FArchive::operator<<(pFVar4,&this->statedata);
  pFVar4 = ::operator<<(pFVar4,&this->activator);
  pFVar4 = ::operator<<(pFVar4,&this->activationline);
  pFVar4 = FArchive::operator<<(pFVar4,&this->backSide);
  FArchive::operator<<(pFVar4,&this->numlocalvars);
  bVar2 = FArchive::IsLoading(_lib_1);
  if (bVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->numlocalvars;
    uVar5 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pSVar6 = (SDWORD *)operator_new__(uVar5);
    this->localvars = pSVar6;
  }
  for (local_1c = 0; local_1c < (uint)this->numlocalvars; local_1c = local_1c + 1) {
    FArchive::operator<<(_lib_1,this->localvars + local_1c);
  }
  bVar2 = FArchive::IsStoring(_lib_1);
  if (bVar2) {
    iVar3 = FBehavior::GetLibraryID(this->activeBehavior);
    local_1e = (WORD)(iVar3 >> 0x14);
    FArchive::operator<<(_lib_1,&local_1e);
    local_1c = FBehavior::PC2Ofs(this->activeBehavior,this->pc);
    FArchive::operator<<(_lib_1,&local_1c);
  }
  else {
    pFVar4 = FArchive::operator<<(_lib_1,&local_20);
    FArchive::operator<<(pFVar4,&local_1c);
    pFVar7 = FBehavior::StaticGetModule((uint)local_20);
    this->activeBehavior = pFVar7;
    piVar8 = FBehavior::Ofs2PC(this->activeBehavior,local_1c);
    this->pc = piVar8;
  }
  pFVar4 = ::operator<<(_lib_1,&this->activefont);
  pFVar4 = FArchive::operator<<(pFVar4,&this->hudwidth);
  FArchive::operator<<(pFVar4,&this->hudheight);
  pFVar4 = FArchive::operator<<(_lib_1,&this->ClipRectLeft);
  pFVar4 = FArchive::operator<<(pFVar4,&this->ClipRectTop);
  pFVar4 = FArchive::operator<<(pFVar4,&this->ClipRectWidth);
  pFVar4 = FArchive::operator<<(pFVar4,&this->ClipRectHeight);
  FArchive::operator<<(pFVar4,&this->WrapWidth);
  FArchive::operator<<(_lib_1,&this->InModuleScriptNumber);
  return;
}

Assistant:

void DLevelScript::Serialize (FArchive &arc)
{
	DWORD i;

	Super::Serialize (arc);

	P_SerializeACSScriptNumber(arc, script, false);

	arc	<< state
		<< statedata
		<< activator
		<< activationline
		<< backSide
		<< numlocalvars;

	if (arc.IsLoading())
	{
		localvars = new SDWORD[numlocalvars];
	}
	for (i = 0; i < (DWORD)numlocalvars; i++)
	{
		arc << localvars[i];
	}

	if (arc.IsStoring ())
	{
		WORD lib = activeBehavior->GetLibraryID() >> LIBRARYID_SHIFT;
		arc << lib;
		i = activeBehavior->PC2Ofs (pc);
		arc << i;
	}
	else
	{
		WORD lib;
		arc << lib << i;
		activeBehavior = FBehavior::StaticGetModule (lib);
		pc = activeBehavior->Ofs2PC (i);
	}

	arc << activefont
		<< hudwidth << hudheight;
	arc << ClipRectLeft << ClipRectTop << ClipRectWidth << ClipRectHeight
		<< WrapWidth;
	arc << InModuleScriptNumber;
}